

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int BIO_indent(BIO *b,int indent,int max)

{
  int iVar1;
  int local_1c;
  uint max_indent_local;
  uint indent_local;
  BIO *bio_local;
  
  local_1c = indent;
  if ((uint)max < (uint)indent) {
    local_1c = max;
  }
  do {
    if (local_1c == 0) {
      return 1;
    }
    iVar1 = BIO_puts(b," ");
    local_1c = local_1c + -1;
  } while (iVar1 == 1);
  return 0;
}

Assistant:

int BIO_indent(BIO *bio, unsigned indent, unsigned max_indent) {
  if (indent > max_indent) {
    indent = max_indent;
  }

  while (indent--) {
    if (BIO_puts(bio, " ") != 1) {
      return 0;
    }
  }
  return 1;
}